

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Spc_Filter.cpp
# Opt level: O0

void __thiscall SPC_Filter::run(SPC_Filter *this,short *io,int count)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  chan_t *pcVar5;
  int s_1;
  short *end;
  int s;
  int delta;
  int f;
  int i;
  int p1;
  int pp1;
  int sum;
  chan_t *c;
  int bass;
  int gain;
  int count_local;
  short *io_local;
  SPC_Filter *this_local;
  
  iVar1 = this->gain;
  if ((this->enabled & 1U) == 0) {
    if (iVar1 != 0x100) {
      io_local = io;
      while (io_local < io + count) {
        iVar4 = *io_local * iVar1;
        s_1 = iVar4 >> 8;
        if ((short)((uint)iVar4 >> 8) != s_1) {
          s_1 = iVar4 >> 0x1f ^ 0x7fff;
        }
        *io_local = (short)s_1;
        io_local = io_local + 1;
      }
    }
  }
  else {
    iVar4 = this->bass;
    c = (chan_t *)(this + 1);
    io_local = io;
    do {
      pcVar5 = c + -1;
      p1 = pcVar5->p1;
      pp1 = c[-1].pp1;
      sum = c[-1].sum;
      for (i = 0; i < count; i = i + 2) {
        iVar2 = io_local[i] + p1;
        p1 = io_local[i] * 3;
        iVar3 = iVar2 - pp1;
        s = sum >> 10;
        if ((short)s != s) {
          s = sum >> 0x1f ^ 0x7fff;
        }
        io_local[i] = (short)s;
        pp1 = iVar2;
        sum = (iVar3 * iVar1 - (sum >> ((byte)iVar4 & 0x1f))) + sum;
      }
      pcVar5->p1 = p1;
      c[-1].pp1 = pp1;
      c[-1].sum = sum;
      io_local = io_local + 1;
      c = pcVar5;
    } while (pcVar5 != this->ch);
  }
  return;
}

Assistant:

void SPC_Filter::run( short* io, int count )
{
	require( (count & 1) == 0 ); // must be even
	
	int const gain = this->gain;
	if ( enabled )
	{
		int const bass = this->bass;
		chan_t* c = &ch [2];
		do
		{
			// cache in registers
			int sum = (--c)->sum;
			int pp1 = c->pp1;
			int p1  = c->p1;
			
			for ( int i = 0; i < count; i += 2 )
			{
				// Low-pass filter (two point FIR with coeffs 0.25, 0.75)
				int f = io [i] + p1;
				p1 = io [i] * 3;
				
				// High-pass filter ("leaky integrator")
				int delta = f - pp1;
				pp1 = f;
				int s = sum >> (gain_bits + 2);
				sum += (delta * gain) - (sum >> bass);
				
				// Clamp to 16 bits
				if ( (short) s != s )
					s = (s >> 31) ^ 0x7FFF;
				
				io [i] = (short) s;
			}
			
			c->p1  = p1;
			c->pp1 = pp1;
			c->sum = sum;
			++io;
		}
		while ( c != ch );
	}
	else if ( gain != gain_unit )
	{
		short* const end = io + count;
		while ( io < end )
		{
			int s = (*io * gain) >> gain_bits;
			if ( (short) s != s )
				s = (s >> 31) ^ 0x7FFF;
			*io++ = (short) s;
		}
	}
}